

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

wchar_t Infoclr_Opcode(char *str)

{
  int iVar1;
  wchar_t wVar2;
  int local_1c;
  wchar_t i;
  char *str_local;
  
  local_1c = 0;
  while( true ) {
    if (opcode_pairs[local_1c << 1] == (char *)0x0) {
      return L'\xffffffff';
    }
    iVar1 = strcmp(opcode_pairs[local_1c << 1],str);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  wVar2 = atoi(opcode_pairs[local_1c * 2 + 1]);
  return wVar2;
}

Assistant:

static int Infoclr_Opcode(const char *str)
{
	register int i;

	/* Scan through all legal operation names */
	for (i = 0; opcode_pairs[i * 2]; ++i) {
		/* Is this the right oprname? */
		if (streq(opcode_pairs[i * 2], str)) {
			/* Convert the second element in the pair into a Code */
			return (atoi(opcode_pairs[i * 2 + 1]));
		}
	}

	/* The code was not found, return -1 */
	return (-1);
}